

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void sf::priv::GlContext::cleanupResource(void)

{
  Lock *unaff_retaddr;
  Lock lock;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  Mutex *in_stack_fffffffffffffff8;
  
  Lock::Lock(unaff_retaddr,in_stack_fffffffffffffff8);
  (anonymous_namespace)::GlContextImpl::resourceCount =
       (anonymous_namespace)::GlContextImpl::resourceCount + -1;
  if ((anonymous_namespace)::GlContextImpl::resourceCount == 0) {
    if ((anonymous_namespace)::GlContextImpl::sharedContext == (long *)0x0) {
      uVar1 = 1;
      goto LAB_00220dbf;
    }
    if ((anonymous_namespace)::GlContextImpl::sharedContext != (long *)0x0) {
      (**(code **)(*(anonymous_namespace)::GlContextImpl::sharedContext + 8))();
    }
    (anonymous_namespace)::GlContextImpl::sharedContext = (long *)0x0;
  }
  uVar1 = 0;
LAB_00220dbf:
  Lock::~Lock((Lock *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void GlContext::cleanupResource()
{
    using GlContextImpl::mutex;
    using GlContextImpl::resourceCount;
    using GlContextImpl::sharedContext;

    // Protect from concurrent access
    Lock lock(mutex);

    // Decrement the resources counter
    resourceCount--;

    // If there's no more resource alive, we can trigger the global context cleanup
    if (resourceCount == 0)
    {
        if (!sharedContext)
            return;

        // Destroy the shared context
        delete sharedContext;
        sharedContext = NULL;
    }
}